

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFATokenizer.h
# Opt level: O3

StdGrammarToken * __thiscall
SGParser::DFATokenizer<SGParser::Generator::StdGrammarToken>::GetNextToken
          (DFATokenizer<SGParser::Generator::StdGrammarToken> *this,StdGrammarToken *token)

{
  TokenizerBase *this_00;
  PosTracker *pPVar1;
  PosTracker *pPVar2;
  uint *__args;
  byte bVar3;
  ushort uVar4;
  char *pcVar5;
  TokenizerBuffer *pTVar6;
  pointer pLVar7;
  iterator __position;
  pointer puVar8;
  size_t sVar9;
  bool bVar10;
  uint uVar11;
  CodeType code;
  uint uVar12;
  size_t sStack_a8;
  PosTracker lastTailPos;
  InputCharReader charReader;
  TokenizerBuffer *local_60;
  char *local_58;
  
  this_00 = &(this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).super_TokenizerBase;
  pPVar1 = &(this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).TailPos;
  bVar3 = *(this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).super_TokenizerBase.
           pTail;
  pPVar2 = &(this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).HeadPos;
  __args = &this->ExpressionStackTop;
  lastTailPos.Offset = (size_t)this_00;
  do {
    sVar9 = (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).TailPos.Offset;
    pPVar2->Line = pPVar1->Line;
    (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).HeadPos.Offset = sVar9;
    TokenizerBase::AdjustHead(this_00);
    if (**(ulong **)(lastTailPos.Offset + 0x18) <= *(ulong *)(lastTailPos.Offset + 0x10)) {
      code = 1;
      break;
    }
    uVar11 = (uint)(this->pDFA->ExpressionStartStates).
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start[this->ExpressionStackTop];
    pcVar5 = (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).super_TokenizerBase.
             pHead;
    pTVar6 = (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).super_TokenizerBase.
             pHeadBuffer;
    sStack_a8 = pPVar1->Line;
    lastTailPos.Line =
         (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).TailPos.Offset;
    local_60 = (TokenizerBuffer *)0x0;
    local_58 = (char *)0x0;
    uVar12 = 0xffff;
    do {
      while( true ) {
        uVar11 = DFA::GetTransitionState(this->pDFA,uVar11,(uint)bVar3);
        if (uVar11 == 0xffff) goto LAB_0013390d;
        uVar4 = (this->pDFA->AcceptStates).
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start[uVar11];
        if (uVar4 == 0) break;
        bVar10 = TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>
                 ::Advance((TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>
                            *)&lastTailPos.Offset);
        sStack_a8 = pPVar1->Line;
        lastTailPos.Line =
             (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).TailPos.Offset;
        local_58 = (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).
                   super_TokenizerBase.pTail;
        local_60 = (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).
                   super_TokenizerBase.pTailBuffer;
        uVar12 = (uint)uVar4;
        if (!bVar10) goto LAB_0013390d;
      }
      bVar10 = TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>
               ::Advance((TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>
                          *)&lastTailPos.Offset);
    } while (bVar10);
LAB_0013390d:
    if (uVar12 == 0xffff) {
      if (((*(ulong *)(lastTailPos.Offset + 0x10) < **(ulong **)(lastTailPos.Offset + 0x18)) ||
          (pcVar5 != (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).
                     super_TokenizerBase.pTail)) ||
         (code = 1,
         pTVar6 != (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).
                   super_TokenizerBase.pTailBuffer)) {
        (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).super_TokenizerBase.pTail
             = pcVar5;
        (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).super_TokenizerBase.
        pTailBuffer = pTVar6;
        sVar9 = (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).HeadPos.Offset;
        pPVar1->Line = pPVar2->Line;
        (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).TailPos.Offset = sVar9;
        code = 0;
        if (*(ulong *)(lastTailPos.Offset + 0x10) < **(ulong **)(lastTailPos.Offset + 0x18)) {
          TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>::
          Advance((TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>
                   *)&lastTailPos.Offset);
        }
      }
      break;
    }
    (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).super_TokenizerBase.pTail =
         local_58;
    (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).super_TokenizerBase.
    pTailBuffer = local_60;
    pPVar1->Line = sStack_a8;
    (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).TailPos.Offset =
         lastTailPos.Line;
    pLVar7 = (this->pDFA->LexemeInfos).
             super__Vector_base<SGParser::LexemeInfo,_std::allocator<SGParser::LexemeInfo>_>._M_impl
             .super__Vector_impl_data._M_start;
    code = pLVar7[uVar12].TokenCode;
    uVar11 = pLVar7[uVar12].Action & 0xf0000000;
    if (uVar11 == 0x10000000) {
LAB_001339b2:
      *__args = pLVar7[uVar12].Action & 0xfffffff;
    }
    else if (uVar11 == 0x30000000) {
      puVar8 = (this->ExpressionStack).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((this->ExpressionStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start == puVar8) {
        *__args = 0;
        code = 0;
        break;
      }
      this->ExpressionStackTop = puVar8[-1];
      (this->ExpressionStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar8 + -1;
    }
    else if (uVar11 == 0x20000000) {
      __position._M_current =
           (this->ExpressionStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->ExpressionStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->ExpressionStack,
                   __position,__args);
      }
      else {
        *__position._M_current = this->ExpressionStackTop;
        (this->ExpressionStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      goto LAB_001339b2;
    }
  } while (code == 0);
  Generator::StdGrammarToken::CopyFromTokenizer(token,code,this);
  return token;
}

Assistant:

Token& DFATokenizer<Token>::GetNextToken(Token& token) {
    CodeType        code;
    InputCharReader charReader{ByteReader{*this}, TailPos};

    do {
        // If we are tracking the position
        // than adjust the head values
        HeadPos = TailPos;

        // Move the head to tail
        AdjustHead();

        // If tail's passed the end, EOF
        if (charReader.IsEOF()) {
            token.CopyFromTokenizer(TokenCode::TokenEOF, *this);
            return token;
        }

        // Try to find the longest matching lexeme
        // Keep going through the DFA until we hit an error condition,
        // that is, we get stuck and have nowhere to go

        // The initial state of a DFA is always the zeroth state
        unsigned state        = pDFA->GetExpressionStartState(ExpressionStackTop);
        unsigned lastLexemeID = DFA::EmptyTransition;
        // Last recognized Tail
        BufferPos lastTail;
        // Save start head, so that we can see if we moved at all
        BufferPos startHead{GetHeadPos()};

        // Save the last tail line and column position
        PosTracker lastTailPos{TailPos};

        unsigned accept;

        do {
            // Get the next state out of the table
            state = pDFA->GetTransitionState(state, charReader.GetChar());

            // EmptyTransition means error condition
            if (state == pDFA->EmptyTransition)
                break;

            // If it's an accepting state, record the pTail position and
            // lexeme ID so we can return them if this turns out to be the longest lexeme
            if (accept = pDFA->GetAcceptState(state); accept != 0u) {
                lastLexemeID = accept;
                accept       = charReader.Advance() ? 1u : 0u;
                lastTailPos  = TailPos;
                lastTail     = GetTailPos();
            } else
                accept = charReader.Advance() ? 1u : 0u;

        } while (accept != 0u);

        // If we didn't find a valid lexeme, raise an error, unless we've
        // got an empty lexeme. In this case, there are simply no more characters
        // remaining in the input stream
        if (lastLexemeID == DFA::EmptyTransition) {
            // If we didn't move, and its the end of file, report EOF
            if (charReader.IsEOF() && startHead == GetTailPos())
                code = TokenCode::TokenEOF;
            else {
                // Error - nothing recognized
                SetTailPos(startHead);
                TailPos = HeadPos;
                code    = TokenCode::TokenError;
                if (!charReader.IsEOF())
                    charReader.Advance();
            }
            token.CopyFromTokenizer(code, *this);
            return token;
        }

        // Put the pTail at the end of the lexeme found
        SetTailPos(lastTail);
        // Set the line/offset values to the end of the last lexeme found
        TailPos = lastTailPos;

        // Otherwise, return the lexeme
        // Should be [*pHead, *LastTailPos]
        const auto& lexinfo = pDFA->GetLexemeInfo(lastLexemeID);
        code                = lexinfo.TokenCode;

        // Perform an action, if any
        switch (lexinfo.Action & LexemeInfo::ActionMask) {
            case LexemeInfo::ActionPush:
                ExpressionStack.push_back(ExpressionStackTop);
                // Fall through to goto
                [[fallthrough]];

            case LexemeInfo::ActionGoto:
                ExpressionStackTop = lexinfo.Action & LexemeInfo::ActionValueMask;
                break;

            case LexemeInfo::ActionPop:
                if (!ExpressionStack.empty()) {
                    ExpressionStackTop = ExpressionStack.back();
                    ExpressionStack.pop_back();
                } else { // Empty stack, error
                    ExpressionStackTop = 0u;
                    token.CopyFromTokenizer(TokenCode::TokenError, *this);
                    return token;
                }
                break;
        }

        // if code == 0, then ignore token
    } while (code == 0u);

    token.CopyFromTokenizer(code, *this);
    return token;
}